

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kern.cxx
# Opt level: O2

void HAXX::Kern<HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>>
               (int32_t M,int32_t N,int32_t K,quaternion<double> *A,quaternion<double> *B,
               quaternion<double> *C,int32_t LDC)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  bool bVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  quaternion<double> qVar9;
  quaternion<double> qVar10;
  quaternion<double> qVar11;
  __m256d bKKKK;
  __m256d bJJJJ;
  __m256d bIIII;
  __m256d bSSSS;
  __m256d a_KKKK;
  __m256d a_IIII;
  __m256d local_1e0;
  __m256d local_1c0;
  __m256d local_1a0;
  __m256d local_180;
  double local_160;
  double dStack_158;
  double dStack_150;
  double dStack_148;
  double local_140;
  double dStack_138;
  double dStack_130;
  double dStack_128;
  double local_120;
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  __m256d local_e0;
  __m256d local_c0;
  double local_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  double local_80;
  double dStack_78;
  double dStack_70;
  double dStack_68;
  
  qVar9 = (quaternion<double>)(SUB6432(ZEXT864(0),0) << 0x40);
  if (M == 2) {
    qVar9 = C[1];
  }
  lVar6 = (long)LDC;
  if (N == 2) {
    qVar10 = C[lVar6];
    if (M == 2) {
      qVar11 = C[lVar6 + 1];
      bVar5 = false;
    }
    else {
      qVar11 = (quaternion<double>)ZEXT1632(ZEXT816(0));
      bVar5 = true;
    }
  }
  else {
    qVar10 = (quaternion<double>)(ZEXT832(0) << 0x40);
    bVar5 = true;
    qVar11 = (quaternion<double>)ZEXT1632(ZEXT816(0));
  }
  auVar3 = vunpcklpd_avx((undefined1  [32])*C,(undefined1  [32])qVar10);
  auVar1 = vunpckhpd_avx((undefined1  [32])*C,(undefined1  [32])qVar10);
  auVar4 = vunpcklpd_avx((undefined1  [32])qVar9,(undefined1  [32])qVar11);
  auVar2 = vunpckhpd_avx((undefined1  [32])qVar9,(undefined1  [32])qVar11);
  local_180[2] = (double)SUB168(auVar4._0_16_,0);
  local_180[3] = (double)SUB168(auVar4._0_16_,8);
  local_180[0] = (double)SUB168(auVar3._0_16_,0);
  local_180[1] = (double)SUB168(auVar3._0_16_,8);
  local_1c0[2] = (double)SUB168(auVar2._0_16_,0);
  local_1c0[3] = (double)SUB168(auVar2._0_16_,8);
  local_1c0[0] = (double)SUB168(auVar1._0_16_,0);
  local_1c0[1] = (double)SUB168(auVar1._0_16_,8);
  local_1a0 = (__m256d)vperm2f128_avx(auVar3,auVar4,0x31);
  local_1e0 = (__m256d)vperm2f128_avx(auVar1,auVar2,0x31);
  if (0 < K) {
    uVar7 = K + 1;
    lVar8 = 0;
    do {
      auVar1 = *(undefined1 (*) [32])((long)&A->_M_real + lVar8);
      auVar2 = *(undefined1 (*) [32])((long)&A[1]._M_real + lVar8);
      local_100 = *(double *)((long)&B->_M_imag_j + lVar8);
      dStack_f8 = *(double *)((long)&B->_M_imag_k + lVar8);
      local_120 = *(double *)((long)&B[1]._M_imag_j + lVar8);
      dStack_118 = *(double *)((long)&B[1]._M_imag_k + lVar8);
      local_140 = *(double *)((long)&B[1]._M_real + lVar8);
      dStack_138 = *(double *)((long)&B[1]._M_imag_i + lVar8);
      local_160 = *(double *)((long)&B[2]._M_real + lVar8);
      dStack_158 = *(double *)((long)&B[2]._M_imag_i + lVar8);
      local_c0 = (__m256d)vshufpd_avx(auVar1,auVar1,0xf);
      local_80 = auVar1._0_8_;
      dStack_70 = auVar1._16_8_;
      local_e0 = (__m256d)vshufpd_avx(auVar2,auVar2,0xf);
      local_a0 = auVar2._0_8_;
      dStack_90 = auVar2._16_8_;
      dStack_150 = local_160;
      dStack_148 = dStack_158;
      dStack_130 = local_140;
      dStack_128 = dStack_138;
      dStack_110 = local_120;
      dStack_108 = dStack_118;
      dStack_f0 = local_100;
      dStack_e8 = dStack_f8;
      dStack_98 = local_a0;
      dStack_88 = dStack_90;
      dStack_78 = local_80;
      dStack_68 = dStack_70;
      INC_MULD4Q_NN((__m256d *)&local_80,&local_c0,(__m256d *)&local_a0,&local_e0,
                    (__m256d *)&local_100,(__m256d *)&local_120,(__m256d *)&local_140,
                    (__m256d *)&local_160,&local_180,&local_1c0,&local_1a0,&local_1e0);
      uVar7 = uVar7 - 1;
      lVar8 = lVar8 + 0x40;
    } while (1 < uVar7);
  }
  auVar1 = vunpcklpd_avx((undefined1  [32])local_180,(undefined1  [32])local_1c0);
  auVar2 = vunpcklpd_avx((undefined1  [32])local_1a0,(undefined1  [32])local_1e0);
  qVar9._M_imag_j = (double)SUB168(auVar2._0_16_,0);
  qVar9._M_imag_k = (double)SUB168(auVar2._0_16_,8);
  qVar9._M_real = (double)SUB168(auVar1._0_16_,0);
  qVar9._M_imag_i = (double)SUB168(auVar1._0_16_,8);
  *C = qVar9;
  if (M == 2) {
    qVar9 = (quaternion<double>)vperm2f128_avx(auVar1,auVar2,0x31);
    C[1] = qVar9;
  }
  auVar1 = vunpckhpd_avx((undefined1  [32])local_1a0,(undefined1  [32])local_1e0);
  auVar2 = vunpckhpd_avx((undefined1  [32])local_180,(undefined1  [32])local_1c0);
  if (N == 2) {
    qVar10._M_imag_j = (double)SUB168(auVar1._0_16_,0);
    qVar10._M_imag_k = (double)SUB168(auVar1._0_16_,8);
    qVar10._M_real = (double)SUB168(auVar2._0_16_,0);
    qVar10._M_imag_i = (double)SUB168(auVar2._0_16_,8);
    C[lVar6] = qVar10;
  }
  if (!bVar5) {
    qVar9 = (quaternion<double>)vperm2f128_avx(auVar2,auVar1,0x31);
    C[lVar6 + 1] = qVar9;
  }
  return;
}

Assistant:

void Kern(HAXX_INT M, HAXX_INT N, HAXX_INT K, 
  quaternion<double>* __restrict__ A, quaternion<double>* __restrict__ B, 
  quaternion<double>* __restrict__ C, HAXX_INT LDC) {

  __m256d t1,t2,t3,t4;

  const bool M2 = (M == 2);
  const bool N2 = (N == 2);

  // Load C
  __m256d c00 = LOAD_256D_UNALIGNED_AS(double,C      );

  __m256d c10 = M2 ? LOAD_256D_UNALIGNED_AS(double,C+1    ) :
                           _mm256_setzero_pd();

  __m256d c01 = N2 ? LOAD_256D_UNALIGNED_AS(double,C+LDC  ) :
                           _mm256_setzero_pd();

  __m256d c11 = ( M2 and N2 ) ?  LOAD_256D_UNALIGNED_AS(double,C+LDC+1) :
                                 _mm256_setzero_pd();

  _MM_TRANSPOSE_4x4_PD(c00,c01,c10,c11,t1,t2,t3,t4);


  quaternion<double> *locB = B, *locA = A;

  HAXX_INT k = K;

  if( k > 0 )
  do {

    // Load A 
    __m256d a00 = LOAD_256D_ALIGNED_AS(double,locA);
    __m256d a10 = LOAD_256D_ALIGNED_AS(double,locA+1);
    locA += 2;
    

    // Load B

#ifndef _FACTOR_TRANSPOSE_INTO_B_PACK
    __m256d b00 = LOAD_256D_ALIGNED_AS(double,locB);
    __m256d b10 = LOAD_256D_ALIGNED_AS(double,locB+1);
#else
    double *BasDouble = reinterpret_cast<double*>(locB);
    __m128d b00lo = LOAD_128D_ALIGNED(BasDouble);
    __m128d b00hi = LOAD_128D_ALIGNED(BasDouble+2);
    __m128d b10lo = LOAD_128D_ALIGNED(BasDouble+4);
    __m128d b10hi = LOAD_128D_ALIGNED(BasDouble+6);
#endif
    locB += 2;


#ifdef _FACTOR_TRANSPOSE_INTO_A_PACK

    __m256d a_IIII = _mm256_permute_pd(a00,0xF);
    a00            = _mm256_permute_pd(a00,0x0); // SSSS
  
    __m256d a_KKKK = _mm256_permute_pd(a10,0xF);
    a10            = _mm256_permute_pd(a10,0x0); // SSSS

    __m256d &a00c = a_IIII;
    __m256d &a10c = a_KKKK;

#else

    __m256d a00c = a00;
    __m256d a10c = a10;
    _MM_TRANSPOSE_4x4_PD(a00,a00c,a10,a10c,t1,t2,t3,t4);

#endif

#ifdef _FACTOR_TRANSPOSE_INTO_B_PACK

    __m256d bSSSS = SET_256D_FROM_128D(b00lo,b00lo);
    __m256d bIIII = SET_256D_FROM_128D(b10lo,b10lo);
    __m256d bJJJJ = SET_256D_FROM_128D(b00hi,b00hi);
    __m256d bKKKK = SET_256D_FROM_128D(b10hi,b10hi);

    __m256d &b00  = bSSSS;
    __m256d &b10  = bIIII;
    __m256d &b00c = bJJJJ;
    __m256d &b10c = bKKKK;

#else

    __m256d b00c = b00;
    __m256d b10c = b10;
    _MM_TRANSPOSE_4x4_PD(b00,b10,b00c,b10c,t1,t2,t3,t4);

#endif

    INC_MULD4Q_NN(a00,a00c,a10,a10c,b00,b10,b00c,b10c,c00,c01,c10,c11);
  

    k--;
  } while( k > 0 );

  _MM_TRANSPOSE_4x4_PD(c00,c01,c10,c11,t1,t2,t3,t4);

  STORE_256D_UNALIGNED_AS(double,C      ,c00);
  if( M2 ) STORE_256D_UNALIGNED_AS(double,C+1    ,c10);
  if( N2 ) STORE_256D_UNALIGNED_AS(double,C+LDC  ,c01);
  if( M2 and N2 ) STORE_256D_UNALIGNED_AS(double,C+LDC+1,c11);
  

}